

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)11,(Piece)6>(Movegen *this)

{
  bool bVar1;
  Movegen *this_local;
  
  if (this->check_target == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    generate<(Movetype)11,(Piece)0>(this);
    generate<(Movetype)11,(Piece)1>(this);
    generate<(Movetype)11,(Piece)2>(this);
    generate<(Movetype)11,(Piece)3>(this);
    generate<(Movetype)11,(Piece)4>(this);
    generate<(Movetype)11,(Piece)5>(this);
  }
  else if ((this->check_target == 0) || (this->evasion_target != 0)) {
    if ((this->check_target != 0) && (this->evasion_target != 0)) {
      bVar1 = bits::more_than_one(&this->check_target);
      if (bVar1) {
        generate<(Movetype)11,(Piece)5>(this);
      }
      else {
        generate<(Movetype)16,(Piece)0>(this);
        generate<(Movetype)11,(Piece)0>(this);
        generate<(Movetype)11,(Piece)5>(this);
        generate<(Movetype)11,(Piece)1>(this);
        generate<(Movetype)11,(Piece)2>(this);
        generate<(Movetype)11,(Piece)3>(this);
        generate<(Movetype)11,(Piece)4>(this);
      }
    }
  }
  else {
    bVar1 = bits::more_than_one(&this->check_target);
    if (bVar1) {
      generate<(Movetype)11,(Piece)5>(this);
    }
    else {
      generate<(Movetype)16,(Piece)0>(this);
      generate<(Movetype)11,(Piece)5>(this);
      generate<(Movetype)11,(Piece)0>(this);
      generate<(Movetype)11,(Piece)1>(this);
      generate<(Movetype)11,(Piece)2>(this);
      generate<(Movetype)11,(Piece)3>(this);
      generate<(Movetype)11,(Piece)4>(this);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<capture, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) {
		generate<capture_promotion, pawn>();
		generate<capture, pawn>();
		generate<capture, knight>();
		generate<capture, bishop>();
		generate<capture, rook>();
		generate<capture, queen>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
		}
		else {
			generate<capture, king>();
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, pawn>();
			generate<capture, king>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
		}
		else {
			generate<capture, king>();
		}
	}
}